

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCnst.cpp
# Opt level: O1

void __thiscall NaPNConstGen::set_const_value(NaPNConstGen *this,NaReal fConst)

{
  NaReal *pNVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  auVar2 = _DAT_0015cfb0;
  uVar3 = (ulong)this->nOutDim;
  if (uVar3 != 0) {
    pNVar1 = this->fConstVal;
    lVar7 = uVar3 - 1;
    auVar5._8_4_ = (int)lVar7;
    auVar5._0_8_ = lVar7;
    auVar5._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar4 = 0;
    auVar5 = auVar5 ^ _DAT_0015cfb0;
    auVar6 = _DAT_0015cfa0;
    do {
      auVar8 = auVar6 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        *(NaReal *)((long)pNVar1 + uVar4) = fConst;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        *(NaReal *)((long)pNVar1 + uVar4 + 8) = fConst;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      uVar4 = uVar4 + 0x10;
    } while ((uVar3 * 8 + 8 & 0xfffffffffffffff0) != uVar4);
  }
  return;
}

Assistant:

void
NaPNConstGen::set_const_value (NaReal fConst)
{
    //!!!check_tunable();

    unsigned    i;
    for(i = 0; i < nOutDim; ++i){
        fConstVal[i] = fConst;
    }
}